

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_inverse_scalar(secp256k1_scalar *out,secp256k1_scalar *x,int var)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  code *pcVar4;
  secp256k1_scalar l;
  secp256k1_scalar r;
  secp256k1_scalar t;
  secp256k1_scalar local_78;
  secp256k1_scalar local_58;
  secp256k1_scalar local_38;
  
  pcVar4 = secp256k1_scalar_inverse_var;
  if (var == 0) {
    pcVar4 = secp256k1_scalar_inverse;
  }
  (*pcVar4)(&local_78);
  if (out != (secp256k1_scalar *)0x0) {
    out->d[2] = local_78.d[2];
    out->d[3] = local_78.d[3];
    out->d[0] = local_78.d[0];
    out->d[1] = local_78.d[1];
  }
  iVar1 = secp256k1_scalar_is_zero(x);
  if (iVar1 == 0) {
    secp256k1_scalar_mul(&local_38,x,&local_78);
    iVar1 = secp256k1_scalar_is_one(&local_38);
    if (iVar1 != 0) {
      secp256k1_scalar_add(&local_58,x,&scalar_minus_one);
      iVar1 = secp256k1_scalar_is_zero(&local_58);
      if (iVar1 == 0) {
        (*pcVar4)(&local_58,&local_58);
        secp256k1_scalar_add(&local_78,&scalar_minus_one,&local_78);
        (*pcVar4)(&local_78,&local_78);
        secp256k1_scalar_add(&local_78,&local_78,&secp256k1_scalar_one);
        secp256k1_scalar_add(&local_78,&local_58,&local_78);
        iVar1 = secp256k1_scalar_is_zero(&local_78);
        if (iVar1 == 0) {
          pcVar3 = "test condition failed: secp256k1_scalar_is_zero(&l)";
          uVar2 = 0xcd0;
          goto LAB_00139fa6;
        }
      }
      return;
    }
    pcVar3 = "test condition failed: secp256k1_scalar_is_one(&t)";
    uVar2 = 0xcc8;
  }
  else {
    iVar1 = secp256k1_scalar_is_zero(&local_78);
    if (iVar1 != 0) {
      return;
    }
    pcVar3 = "test condition failed: secp256k1_scalar_is_zero(&l)";
    uVar2 = 0xcc4;
  }
LAB_00139fa6:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c",
          uVar2,pcVar3);
  abort();
}

Assistant:

static void test_inverse_scalar(secp256k1_scalar* out, const secp256k1_scalar* x, int var)
{
    secp256k1_scalar l, r, t;

    (var ? secp256k1_scalar_inverse_var : secp256k1_scalar_inverse)(&l, x);  /* l = 1/x */
    if (out) *out = l;
    if (secp256k1_scalar_is_zero(x)) {
        CHECK(secp256k1_scalar_is_zero(&l));
        return;
    }
    secp256k1_scalar_mul(&t, x, &l);                                             /* t = x*(1/x) */
    CHECK(secp256k1_scalar_is_one(&t));                                          /* x*(1/x) == 1 */
    secp256k1_scalar_add(&r, x, &scalar_minus_one);                              /* r = x-1 */
    if (secp256k1_scalar_is_zero(&r)) return;
    (var ? secp256k1_scalar_inverse_var : secp256k1_scalar_inverse)(&r, &r); /* r = 1/(x-1) */
    secp256k1_scalar_add(&l, &scalar_minus_one, &l);                             /* l = 1/x-1 */
    (var ? secp256k1_scalar_inverse_var : secp256k1_scalar_inverse)(&l, &l); /* l = 1/(1/x-1) */
    secp256k1_scalar_add(&l, &l, &secp256k1_scalar_one);                         /* l = 1/(1/x-1)+1 */
    secp256k1_scalar_add(&l, &r, &l);                                            /* l = 1/(1/x-1)+1 + 1/(x-1) */
    CHECK(secp256k1_scalar_is_zero(&l));                                         /* l == 0 */
}